

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerSMC::ArchiveIN(ChContactContainerSMC *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChContactContainerSMC>(marchive);
  ChContactContainer::ArchiveIN(&this->super_ChContactContainer,marchive);
  (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])(this);
  return;
}

Assistant:

void ChContactContainerSMC::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContactContainerSMC>();
    // deserialize parent class
    ChContactContainer::ArchiveIN(marchive);
    // stream in all member data:
    RemoveAllContacts();
    // NO SERIALIZATION of contact list because assume it is volatile and generated when needed
}